

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

CommandOptions * read_JP2K_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **__s;
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  long *plVar4;
  Dictionary *pDVar5;
  byte_t *pbVar6;
  unsigned_long_long *puVar7;
  AESDecContext *this;
  HMACContext *this_00;
  uint *puVar8;
  IFileReaderFactory *in_RDX;
  uint local_a90;
  Result_t local_9d0 [111];
  allocator<char> local_961;
  string local_960 [32];
  string local_940 [112];
  FileWriter local_8d0 [4];
  ui32_t write_count;
  FileWriter OutFile;
  char local_898 [8];
  char filename [1024];
  uint local_42c;
  char local_428 [4];
  ui32_t i;
  char name_format [64];
  uint local_3dc;
  Result_t local_3d8 [4];
  ui32_t last_frame;
  undefined1 local_370 [112];
  WriterInfo Info;
  Result_t local_1e8 [104];
  Result_t local_180 [104];
  long *local_118;
  CDCIEssenceDescriptor *cdci_descriptor;
  RGBAEssenceDescriptor *rgba_descriptor;
  string local_100 [32];
  string local_e0 [8];
  Result_t result;
  uint local_78;
  ui32_t frame_count;
  undefined1 local_68 [8];
  FrameBuffer FrameBuffer;
  MXFReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  
  AS_02::JP2K::MXFReader::MXFReader((MXFReader *)&FrameBuffer.field_0x20,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_68,
             *(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  local_78 = 0;
  __s = fileReaderFactory[0xb]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,(char *)__s,(allocator<char> *)((long)&rgba_descriptor + 7));
  AS_02::JP2K::MXFReader::OpenRead(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rgba_descriptor + 7));
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
  if (-1 < iVar2) {
    if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    cdci_descriptor = (CDCIEssenceDescriptor *)0x0;
    local_118 = (long *)0x0;
    plVar4 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
    pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
    pbVar6 = ASDCP::Dictionary::ul(pDVar5,MDD_RGBAEssenceDescriptor);
    (**(code **)(*plVar4 + 0xa8))(local_180,plVar4,pbVar6);
    Kumu::Result_t::operator=((Result_t *)local_e0,local_180);
    Kumu::Result_t::~Result_t(local_180);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
    if (iVar2 < 0) {
      plVar4 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
      pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
      pbVar6 = ASDCP::Dictionary::ul(pDVar5,MDD_CDCIEssenceDescriptor);
      (**(code **)(*plVar4 + 0xa8))(local_1e8,plVar4,pbVar6);
      Kumu::Result_t::operator=((Result_t *)local_e0,local_1e8);
      Kumu::Result_t::~Result_t(local_1e8);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
      if (iVar2 < 0) {
        fprintf(_stderr,"File does not contain an essence descriptor.\n");
        AS_02::JP2K::MXFReader::AS02IndexReader();
        local_78 = AS_02::MXF::AS02IndexReader::GetDuration();
      }
      else {
        if (local_118 == (long *)0x0) {
          __assert_fail("cdci_descriptor",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                        ,0x14f,
                        "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)"
                       );
        }
        bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                          ((optional_property<unsigned_long_long> *)(local_118 + 0x1f));
        if (!bVar1) {
          puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                             ((optional_property *)(local_118 + 0x1f));
          local_78 = (uint)*puVar7;
        }
        if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
          (**(code **)(*local_118 + 0x88))(local_118,0);
        }
      }
    }
    else {
      if (cdci_descriptor == (CDCIEssenceDescriptor *)0x0) {
        __assert_fail("rgba_descriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x13e,
                      "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)")
        ;
      }
      bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                        ((optional_property<unsigned_long_long> *)(cdci_descriptor + 0xf8));
      if (!bVar1) {
        puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                           ((optional_property *)(cdci_descriptor + 0xf8));
        local_78 = (uint)*puVar7;
      }
      if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
        (**(code **)(*(long *)cdci_descriptor + 0x88))(cdci_descriptor,0);
      }
    }
    if (local_78 == 0) {
      AS_02::JP2K::MXFReader::AS02IndexReader();
      local_78 = AS_02::MXF::AS02IndexReader::GetDuration();
    }
    if (local_78 == 0) {
      fprintf(_stderr,"Unable to determine file duration.\n");
      Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
      goto LAB_0011064f;
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
  if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x100) != 0)) {
    this = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this);
    ASDCP::AESDecContext::InitKey((uchar *)&Info.LabelSetType);
    Kumu::Result_t::operator=((Result_t *)local_e0,(Result_t *)&Info.LabelSetType);
    Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000) != 0)) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_370 + 0x68));
      AS_02::JP2K::MXFReader::FillWriterInfo((WriterInfo *)local_370);
      Kumu::Result_t::~Result_t((Result_t *)local_370);
      if ((Info.CryptographicKeyID[9] & 1) == 0) {
        fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
      }
      else {
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_3d8,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)local_e0,local_3d8);
        Kumu::Result_t::~Result_t(local_3d8);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(local_370 + 0x68));
    }
  }
  if (*(int *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    local_a90 = local_78;
  }
  else {
    local_a90 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  }
  local_3dc = *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) + local_a90;
  if (local_78 < local_3dc) {
    local_3dc = local_78;
  }
  snprintf(local_428,0x40,"%%s%%0%du.j2c",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory);
  for (local_42c = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0),
      -1 < iVar2 && local_42c < local_3dc; local_42c = local_42c + 1) {
    AS_02::JP2K::MXFReader::ReadFrame
              ((int)filename + 0x3f8,(FrameBuffer *)&FrameBuffer.field_0x20,
               (AESDecContext *)(ulong)local_42c,(HMACContext *)local_68);
    Kumu::Result_t::operator=((Result_t *)local_e0,(Result_t *)(filename + 0x3f8));
    Kumu::Result_t::~Result_t((Result_t *)(filename + 0x3f8));
    snprintf(local_898,0x400,local_428,fileReaderFactory[6]._vptr_IFileReaderFactory,
             (ulong)local_42c);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0))
    {
      uVar3 = ASDCP::FrameBuffer::Size((FrameBuffer *)local_68);
      printf("Frame %d, %d bytes",(ulong)local_42c,(ulong)uVar3);
      if (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100000000) == 0) {
        printf(" -> %s",local_898);
      }
      printf("\n");
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100000000) == 0))
    {
      Kumu::FileWriter::FileWriter(local_8d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_960,local_898,&local_961);
      Kumu::FileWriter::OpenWrite(local_940);
      Kumu::Result_t::operator=((Result_t *)local_e0,(Result_t *)local_940);
      Kumu::Result_t::~Result_t((Result_t *)local_940);
      std::__cxx11::string::~string(local_960);
      std::allocator<char>::~allocator(&local_961);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
      if (-1 < iVar2) {
        puVar8 = (uint *)ASDCP::FrameBuffer::Data((FrameBuffer *)local_68);
        ASDCP::FrameBuffer::Size((FrameBuffer *)local_68);
        Kumu::FileWriter::Write((uchar *)local_9d0,(uint)local_8d0,puVar8);
        Kumu::Result_t::operator=((Result_t *)local_e0,local_9d0);
        Kumu::Result_t::~Result_t(local_9d0);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_e0);
      if ((-1 < iVar2) &&
         (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0)) {
        ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_68,(uint)_stderr);
      }
      Kumu::FileWriter::~FileWriter(local_8d0);
    }
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)local_e0);
LAB_0011064f:
  Kumu::Result_t::~Result_t((Result_t *)local_e0);
  ASDCP::JP2K::FrameBuffer::~FrameBuffer((FrameBuffer *)local_68);
  AS_02::JP2K::MXFReader::~MXFReader((MXFReader *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
read_JP2K_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*         Context = 0;
  HMACContext*           HMAC = 0;
  AS_02::JP2K::MXFReader Reader(fileReaderFactory);
  JP2K::FrameBuffer      FrameBuffer(Options.fb_size);
  ui32_t                 frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}

      ASDCP::MXF::RGBAEssenceDescriptor *rgba_descriptor = 0;
      ASDCP::MXF::CDCIEssenceDescriptor *cdci_descriptor = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&rgba_descriptor));

      if ( KM_SUCCESS(result) )
	{
	  assert(rgba_descriptor);
          if ( ! rgba_descriptor->ContainerDuration.empty() )
            {
	      frame_count = (ui32_t)rgba_descriptor->ContainerDuration;
            }
	  if ( Options.verbose_flag )
	    {
	      rgba_descriptor->Dump();
	    }
	}
      else
	{
	  result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor),
							 reinterpret_cast<MXF::InterchangeObject**>(&cdci_descriptor));

	  if ( KM_SUCCESS(result) )
	    {
	      assert(cdci_descriptor);
              if ( ! cdci_descriptor->ContainerDuration.empty() )
                {
	          frame_count = (ui32_t)cdci_descriptor->ContainerDuration;
                }
	      if ( Options.verbose_flag )
		{
		  cdci_descriptor->Dump();
		}
	    }
	  else
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      frame_count = Reader.AS02IndexReader().GetDuration();
	    }
	}

      if ( frame_count == 0 )
	{
	  frame_count = Reader.AS02IndexReader().GetDuration();
	}

      if ( frame_count == 0 )
	{
	  fprintf(stderr, "Unable to determine file duration.\n");
	  return RESULT_FAIL;
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      char filename[1024];
      snprintf(filename, 1024, name_format, Options.file_prefix, i);

      if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	{
	  printf("Frame %d, %d bytes", i, FrameBuffer.Size());

	  if ( ! Options.no_write_flag )
	    {
	      printf(" -> %s", filename);
	    }

	  printf("\n");
	}

      if ( ASDCP_SUCCESS(result)  && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);

	  if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	    {
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }
	}
    }

  return result;
}